

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.h
# Opt level: O0

void __thiscall Threadpool<Searchthread>::wait_finished(Threadpool<Searchthread> *this)

{
  undefined1 local_20 [8];
  unique_lock<std::mutex> lock;
  Threadpool<Searchthread> *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->m);
  std::condition_variable::wait<Threadpool<Searchthread>::wait_finished()::_lambda()_1_>
            (&this->cv_finished,(unique_lock<std::mutex> *)local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void wait_finished() {
		std::unique_lock<std::mutex> lock(m);
		cv_finished.wait(lock, [this]() { return tasks.empty() && (busy == 0); });
	}